

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O3

int __thiscall ServerSocketUDP::bindServer(ServerSocketUDP *this)

{
  ushort uVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  char ip [16];
  sockaddr_in serverAddress;
  char acStack_38 [16];
  sockaddr local_28;
  
  getLocalIP(acStack_38);
  local_28.sa_family = 2;
  local_28.sa_data._2_4_ = inet_addr(acStack_38);
  uVar1 = (ushort)this->portNumber;
  local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  iVar2 = bind(this->serverSocketFD,&local_28,0x10);
  if (-1 < iVar2) {
    return 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error in binding: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Error Code: ");
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

int ServerSocketUDP::bindServer() {

    struct sockaddr_in serverAddress;
    char ip[16];
    getLocalIP(ip);
    serverAddress.sin_family = AF_INET; //指定协议地址族
    serverAddress.sin_addr.s_addr = inet_addr(ip);
    serverAddress.sin_port = htons(this->portNumber);

    //绑定对应端口，监听服务
    if (bind(this->serverSocketFD, (struct sockaddr *) &serverAddress, sizeof(serverAddress)) < 0) {
        cerr << "Error in binding: " << endl;
        cout << "Error Code: " << strerror(errno) << endl;
        exit(1);
    }
    return 1;
}